

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void walMerge(u32 *aContent,ht_slot *aLeft,int nLeft,ht_slot **paRight,int *pnRight,ht_slot *aTmp)

{
  int iVar1;
  u32 uVar2;
  ht_slot *phVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ushort *puVar9;
  
  iVar1 = *pnRight;
  phVar3 = *paRight;
  iVar6 = 0;
  uVar4 = 0;
  iVar5 = 0;
  iVar8 = 0;
  while ((iVar5 < iVar1 || (iVar8 < nLeft))) {
    if ((iVar8 < nLeft) && ((iVar1 <= iVar5 || (aContent[aLeft[iVar8]] < aContent[phVar3[iVar5]]))))
    {
      puVar9 = aLeft + iVar8;
      iVar8 = iVar8 + 1;
    }
    else {
      lVar7 = (long)iVar5;
      iVar5 = iVar5 + 1;
      puVar9 = phVar3 + lVar7;
    }
    uVar2 = aContent[*puVar9];
    *(ushort *)((long)aTmp + uVar4) = *puVar9;
    if (iVar8 < nLeft) {
      iVar8 = iVar8 + (uint)(aContent[aLeft[iVar8]] == uVar2);
    }
    uVar4 = uVar4 + 2;
    iVar6 = iVar6 + 1;
  }
  *paRight = aLeft;
  *pnRight = iVar6;
  memcpy(aLeft,aTmp,uVar4 & 0xffffffff);
  return;
}

Assistant:

static void walMerge(
  const u32 *aContent,            /* Pages in wal - keys for the sort */
  ht_slot *aLeft,                 /* IN: Left hand input list */
  int nLeft,                      /* IN: Elements in array *paLeft */
  ht_slot **paRight,              /* IN/OUT: Right hand input list */
  int *pnRight,                   /* IN/OUT: Elements in *paRight */
  ht_slot *aTmp                   /* Temporary buffer */
){
  int iLeft = 0;                  /* Current index in aLeft */
  int iRight = 0;                 /* Current index in aRight */
  int iOut = 0;                   /* Current index in output buffer */
  int nRight = *pnRight;
  ht_slot *aRight = *paRight;

  assert( nLeft>0 && nRight>0 );
  while( iRight<nRight || iLeft<nLeft ){
    ht_slot logpage;
    Pgno dbpage;

    if( (iLeft<nLeft) 
     && (iRight>=nRight || aContent[aLeft[iLeft]]<aContent[aRight[iRight]])
    ){
      logpage = aLeft[iLeft++];
    }else{
      logpage = aRight[iRight++];
    }
    dbpage = aContent[logpage];

    aTmp[iOut++] = logpage;
    if( iLeft<nLeft && aContent[aLeft[iLeft]]==dbpage ) iLeft++;

    assert( iLeft>=nLeft || aContent[aLeft[iLeft]]>dbpage );
    assert( iRight>=nRight || aContent[aRight[iRight]]>dbpage );
  }

  *paRight = aLeft;
  *pnRight = iOut;
  memcpy(aLeft, aTmp, sizeof(aTmp[0])*iOut);
}